

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O0

bool CheckEthernetV3(AmpIO *Board,uint chan)

{
  bool bVar1;
  ostream *poVar2;
  void *pvVar3;
  char *pcVar4;
  bool local_59;
  ushort local_38;
  ushort local_36;
  ushort local_34;
  char local_31;
  uint16_t phyCR;
  uint16_t phyreg21;
  uint16_t phyreg17;
  char local_29;
  int local_28;
  uint16_t local_24;
  uint16_t local_22;
  uint local_20;
  uint16_t phyid2;
  uint16_t phyid1;
  uint phyAddr;
  uint chan_local;
  AmpIO *Board_local;
  
  local_20 = 1;
  _phyid2 = chan;
  _phyAddr = Board;
  bVar1 = CheckRTL8211F_RegIO(Board,chan,1);
  if (bVar1) {
    local_22 = 0;
    local_24 = 0;
    bVar1 = FpgaIO::ReadRTL8211F_Register(&_phyAddr->super_FpgaIO,_phyid2,local_20,2,&local_22);
    if (!bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Failed to read PHY");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,_phyid2);
      poVar2 = std::operator<<(poVar2," PHYID1");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = FpgaIO::ReadRTL8211F_Register(&_phyAddr->super_FpgaIO,_phyid2,local_20,3,&local_24);
    if (!bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Failed to read PHY");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,_phyid2);
      poVar2 = std::operator<<(poVar2," PHYID2");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"PHY");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,_phyid2);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,std::hex);
    poVar2 = std::operator<<(poVar2," PHYID1: ");
    local_28 = (int)std::setw(4);
    poVar2 = std::operator<<(poVar2,(_Setw)local_28);
    local_29 = (char)std::setfill<char>('0');
    poVar2 = std::operator<<(poVar2,local_29);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_22);
    poVar2 = std::operator<<(poVar2," (should be 001c),");
    poVar2 = std::operator<<(poVar2," PHYID2: ");
    _phyCR = std::setw(4);
    poVar2 = std::operator<<(poVar2,_phyCR);
    local_31 = (char)std::setfill<char>('0');
    poVar2 = std::operator<<(poVar2,local_31);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_24);
    poVar2 = std::operator<<(poVar2," (should be c916)");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    bVar1 = FpgaIO::WriteRTL8211F_Register(&_phyAddr->super_FpgaIO,_phyid2,local_20,0x1f,0xd08);
    if (!bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Failed to set PHY");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,_phyid2);
      poVar2 = std::operator<<(poVar2," PAGSR to 0xd08");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = FpgaIO::ReadRTL8211F_Register(&_phyAddr->super_FpgaIO,_phyid2,local_20,0x11,&local_34);
    if (!bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Failed to read PHY");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,_phyid2);
      poVar2 = std::operator<<(poVar2," Page 0xd08, Reg 17");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"PHY");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,_phyid2);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,std::hex);
    poVar2 = std::operator<<(poVar2," Page 0xd08, Register 17: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,local_34);
    pvVar3 = (void *)std::ostream::operator<<(pvVar3,std::dec);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Tx Delay: ");
    pcVar4 = "OFF";
    if ((local_34 & 0x100) != 0) {
      pcVar4 = "ON";
    }
    poVar2 = std::operator<<(poVar2,pcVar4);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    bVar1 = FpgaIO::ReadRTL8211F_Register(&_phyAddr->super_FpgaIO,_phyid2,local_20,0x15,&local_36);
    if (!bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Failed to read PHY");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,_phyid2);
      poVar2 = std::operator<<(poVar2," Page 0xd08, Reg 21");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"PHY");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,_phyid2);
    poVar2 = (ostream *)std::ostream::operator<<(pvVar3,std::hex);
    poVar2 = std::operator<<(poVar2," Page 0xd08, Register 21: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,local_36);
    pvVar3 = (void *)std::ostream::operator<<(pvVar3,std::dec);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Rx Delay: ");
    pcVar4 = "OFF";
    if ((local_36 & 8) != 0) {
      pcVar4 = "ON";
    }
    poVar2 = std::operator<<(poVar2,pcVar4);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    bVar1 = FpgaIO::WriteRTL8211F_Register(&_phyAddr->super_FpgaIO,_phyid2,local_20,0x1f,0xa42);
    if (!bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Failed to write PHY");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,_phyid2);
      poVar2 = std::operator<<(poVar2," PAGSR");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = FpgaIO::ReadRTL8211F_Register(&_phyAddr->super_FpgaIO,_phyid2,8,0x10,&local_38);
    if (bVar1) {
      poVar2 = (ostream *)std::ostream::operator<<(&std::cout,std::hex);
      poVar2 = std::operator<<(poVar2,"GMII PHY Reg 16: ");
      pvVar3 = (void *)std::ostream::operator<<(poVar2,local_38);
      pvVar3 = (void *)std::ostream::operator<<(pvVar3,std::dec);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"Failed to read GMII PHY");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,_phyid2);
      poVar2 = std::operator<<(poVar2," Reg 16");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    local_59 = local_22 == 0x1c && local_24 == 0xc916;
    Board_local._7_1_ = local_59;
  }
  else {
    Board_local._7_1_ = false;
  }
  return Board_local._7_1_;
}

Assistant:

bool CheckEthernetV3(AmpIO &Board, unsigned int chan)
{
    unsigned int phyAddr = FpgaIO::PHY_RTL8211F;

    // Check Register I/O
    if (!CheckRTL8211F_RegIO(Board, chan, phyAddr))
        return false;

    // Check PHYID1 and PHYID2 (assumes we are on correct page)
    uint16_t phyid1 = 0, phyid2 = 0;
    if (!Board.ReadRTL8211F_Register(chan, phyAddr, FpgaIO::RTL8211F_PHYID1, phyid1))
        std::cout << "Failed to read PHY" << chan << " PHYID1" << std::endl;
    if (!Board.ReadRTL8211F_Register(chan, phyAddr, FpgaIO::RTL8211F_PHYID2, phyid2))
        std::cout << "Failed to read PHY" << chan << " PHYID2" << std::endl;
    std::cout << "PHY" << chan << std::hex
              << " PHYID1: " << std::setw(4) << std::setfill('0') << phyid1 << " (should be 001c),"
              << " PHYID2: " << std::setw(4) << std::setfill('0') << phyid2 << " (should be c916)"
              << std::dec << std::endl;

    // Now, check undocumented registers 0x11 (17) and 0x15 (21) on page 0xd08
    //   Register 17, Bit 8 (0x0100) indicates state of TX_DELAY
    //   Register 21, Bit 3 (0x0008) indicates state of RX_DELAY
    if (!Board.WriteRTL8211F_Register(chan, phyAddr, FpgaIO::RTL8211F_PAGSR, 0xd08))
        std::cout << "Failed to set PHY" << chan << " PAGSR to 0xd08" << std::endl;
    uint16_t phyreg17, phyreg21;
    if (!Board.ReadRTL8211F_Register(chan, phyAddr, 17, phyreg17))
        std::cout << "Failed to read PHY" << chan << " Page 0xd08, Reg 17" << std::endl;
    std::cout << "PHY" << chan << std::hex << " Page 0xd08, Register 17: " << phyreg17 << std::dec << std::endl;
    std::cout << "Tx Delay: " << ((phyreg17 & 0x0100) ? "ON" : "OFF") << std::endl;
    if (!Board.ReadRTL8211F_Register(chan, phyAddr, 21, phyreg21))
        std::cout << "Failed to read PHY" << chan << " Page 0xd08, Reg 21" << std::endl;
    std::cout << "PHY" << chan << std::hex << " Page 0xd08, Register 21: " << phyreg21 << std::dec << std::endl;
    std::cout << "Rx Delay: " << ((phyreg21 & 0x0008) ? "ON" : "OFF") << std::endl;

    // Restore default page
    if (!Board.WriteRTL8211F_Register(chan, phyAddr, FpgaIO::RTL8211F_PAGSR, FpgaIO::RTL8211F_PAGE_DEFAULT))
        std::cout << "Failed to write PHY" << chan << " PAGSR" << std::endl;

    // Check GMII to RGMII core PHY register
    // Based on the VHDL source code for this core, PHY Specific Control Register 1 should be at address 16
    uint16_t phyCR;
    if (!Board.ReadRTL8211F_Register(chan, FpgaIO::PHY_GMII_CORE, 16, phyCR)) {
        std::cout << "Failed to read GMII PHY" << chan << " Reg 16" << std::endl;
    }
    else {
        std::cout << std::hex << "GMII PHY Reg 16: " << phyCR << std::dec << std::endl;
    }

    return (phyid1 == 0x001c) && (phyid2 == 0xc916);
}